

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2511f0d::entry_to_remove::entry_to_remove
          (entry_to_remove *this,string *name,cmMakefile *makefile)

{
  cmValue cVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string local_98;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_78;
  size_type local_60;
  pointer local_58;
  undefined8 local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  
  this->count = -1;
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  (this->value)._M_string_length = 0;
  (this->value).field_2._M_local_buf[0] = '\0';
  local_78.first._M_len = 0x1a;
  local_78.first._M_str = "_CMAKE_SYSTEM_PREFIX_PATH_";
  local_78.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_58 = (name->_M_dataplus)._M_p;
  local_60 = name->_M_string_length;
  local_50 = 0;
  local_48 = 0xd;
  local_40 = "_PREFIX_COUNT";
  local_38 = 0;
  views._M_len = 3;
  views._M_array = &local_78;
  cmCatViews(&local_98,views);
  cVar1 = cmMakefile::GetDefinition(makefile,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (cVar1.Value != (string *)0x0) {
    cmStrToLong(cVar1.Value,&this->count);
  }
  local_78.first._M_len = 0x1a;
  local_78.first._M_str = "_CMAKE_SYSTEM_PREFIX_PATH_";
  local_78.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_58 = (name->_M_dataplus)._M_p;
  local_60 = name->_M_string_length;
  local_50 = 0;
  local_48 = 0xd;
  local_40 = "_PREFIX_VALUE";
  local_38 = 0;
  views_00._M_len = 3;
  views_00._M_array = &local_78;
  cmCatViews(&local_98,views_00);
  cVar1 = cmMakefile::GetDefinition(makefile,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (cVar1.Value != (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)&this->value);
  }
  return;
}

Assistant:

entry_to_remove(std::string const& name, cmMakefile* makefile)
    : value()
  {
    if (cmValue to_skip = makefile->GetDefinition(
          cmStrCat("_CMAKE_SYSTEM_PREFIX_PATH_", name, "_PREFIX_COUNT"))) {
      cmStrToLong(*to_skip, &count);
    }
    if (cmValue prefix_value = makefile->GetDefinition(
          cmStrCat("_CMAKE_SYSTEM_PREFIX_PATH_", name, "_PREFIX_VALUE"))) {
      value = *prefix_value;
    }
  }